

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasmtool.c
# Opt level: O3

INT32 regstr_to_idx(char *Reg)

{
  int iVar1;
  INT32 i;
  long lVar2;
  char **ppcVar3;
  
  ppcVar3 = regstr_to_idx::reg64;
  lVar2 = 0;
  do {
    iVar1 = strcasecmp(Reg,*ppcVar3);
    if (iVar1 == 0) goto LAB_001584db;
    lVar2 = lVar2 + 1;
    ppcVar3 = ppcVar3 + 1;
  } while (lVar2 != 0x10);
  lVar2 = 0xffffffff;
LAB_001584db:
  return (INT32)lVar2;
}

Assistant:

INT32
regstr_to_idx(
    _In_ const char *Reg
    )
{
    static const char *reg64[] =
    {
        "rax", "rcx", "rdx", "rbx", "rsp", "rbp", "rsi", "rdi",
        "r8",  "r9",  "r10", "r11", "r12", "r13", "r14", "r15"
    };

    for (INT32 i = 0; i < (INT32)ARRAYSIZE(reg64); i++)
    {
        if (!_stricmp(Reg, reg64[i]))
        {
            return i;
        }
    }

    return -1;
}